

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

aiQuaternion Read<aiQuaterniont<float>>(IOStream *stream)

{
  aiQuaternion aVar1;
  float fVar2;
  IOStream *stream_local;
  aiQuaternion v;
  
  aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&stream_local);
  stream_local._0_4_ = Read<float>(stream);
  stream_local._4_4_ = Read<float>(stream);
  v.w = Read<float>(stream);
  fVar2 = Read<float>(stream);
  aVar1.x = stream_local._4_4_;
  aVar1.w = stream_local._0_4_;
  aVar1.y = v.w;
  aVar1.z = fVar2;
  return aVar1;
}

Assistant:

aiQuaternion Read<aiQuaternion>(IOStream * stream) {
    aiQuaternion v;
    v.w = Read<float>(stream);
    v.x = Read<float>(stream);
    v.y = Read<float>(stream);
    v.z = Read<float>(stream);
    return v;
}